

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O3

uint32_t helper_addr_h(CPUTriCoreState *env,uint64_t r1,uint32_t r2_l,uint32_t r2_h)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  lVar5 = (long)(int)r2_l + (long)(int)r1;
  lVar3 = (long)(int)r2_h + ((long)r1 >> 0x20);
  iVar1 = (int)lVar3;
  uVar7 = iVar1 + 0x8000;
  iVar4 = (int)lVar5;
  uVar2 = iVar4 + 0x8000;
  uVar6 = (uint)(lVar3 - 0x7fff8000U < 0xffffffff00000000 ||
                lVar5 - 0x7fff8000U < 0xffffffff00000000) << 0x1f;
  env->PSW_USB_V = uVar6;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar6;
  uVar6 = iVar1 * 2 + 0x10000U ^ uVar7 | iVar4 * 2 + 0x10000U ^ uVar2;
  env->PSW_USB_AV = uVar6;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar6;
  return uVar2 >> 0x10 | uVar7 & 0xffff0000;
}

Assistant:

static inline int64_t sextract64(uint64_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 64 - start);
    /* Note that this implementation relies on right shift of signed
     * integers being an arithmetic shift.
     */
    return ((int64_t)(value << (64 - length - start))) >> (64 - length);
}